

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

ssize_t __thiscall QRingBuffer::read(QRingBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  Data *pDVar1;
  QRingChunk *pQVar2;
  iterator iVar3;
  undefined4 in_register_00000034;
  QList<QRingChunk> *this_00;
  long in_FS_OFFSET;
  value_type v;
  QRingChunk local_48;
  long local_20;
  
  this_00 = (QList<QRingChunk> *)CONCAT44(in_register_00000034,__fd);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = this_00[1].d.d;
  if (pDVar1 == (Data *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (this->buffers).d.d = (Data *)0x0;
      (this->buffers).d.ptr = (QRingChunk *)0x0;
      (this->buffers).d.size = 0;
      return (ssize_t)this;
    }
  }
  else {
    pQVar2 = (this_00->d).ptr;
    this_00[1].d.d = (Data *)((long)pDVar1 + (pQVar2->headOffset - pQVar2->tailOffset));
    iVar3 = QList<QRingChunk>::begin(this_00);
    local_48.chunk.d.d = ((iVar3.i)->chunk).d.d;
    local_48.chunk.d.ptr = ((iVar3.i)->chunk).d.ptr;
    ((iVar3.i)->chunk).d.d = (Data *)0x0;
    ((iVar3.i)->chunk).d.ptr = (char *)0x0;
    local_48.chunk.d.size = ((iVar3.i)->chunk).d.size;
    ((iVar3.i)->chunk).d.size = 0;
    local_48.headOffset = (iVar3.i)->headOffset;
    local_48.tailOffset = (iVar3.i)->tailOffset;
    QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst((QGenericArrayOps<QRingChunk> *)this_00);
    QRingChunk::toByteArray((QByteArray *)this,&local_48);
    if (&(local_48.chunk.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_48.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_48.chunk.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (ssize_t)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QRingBuffer::read()
{
    if (bufferSize == 0)
        return QByteArray();

    bufferSize -= buffers.constFirst().size();
    return buffers.takeFirst().toByteArray();
}